

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

bool __thiscall
Am_Value_List_Data::operator==(Am_Value_List_Data *this,Am_Value_List_Data *test_value)

{
  Am_Wrapper *test_value_00;
  Am_Wrapper *this_00;
  bool bVar1;
  anon_union_8_8_ea4c8939_for_value *paVar2;
  anon_union_8_8_ea4c8939_for_value *paVar3;
  
  paVar3 = (anon_union_8_8_ea4c8939_for_value *)&this->head;
  paVar2 = (anon_union_8_8_ea4c8939_for_value *)&test_value->head;
  while( true ) {
    test_value_00 = paVar2->wrapper_value;
    this_00 = paVar3->wrapper_value;
    if ((this_00 == (Am_Wrapper *)0x0) || (test_value_00 == (Am_Wrapper *)0x0)) break;
    bVar1 = Am_Value::operator==((Am_Value *)this_00,(Am_Value *)test_value_00);
    if (!bVar1) {
      return false;
    }
    paVar3 = &((Am_Value *)(this_00 + 1))->value;
    paVar2 = &((Am_Value *)(test_value_00 + 1))->value;
  }
  return this_00 == (Am_Wrapper *)0x0 && test_value_00 == (Am_Wrapper *)0x0;
}

Assistant:

bool
Am_Value_List_Data::operator==(const Am_Value_List_Data &test_value) const
{
  Am_List_Item *curr1 = head;
  Am_List_Item *curr2 = test_value.head;
  while ((curr1 != nullptr) && (curr2 != nullptr)) {
    if (!(*curr1 == *curr2))
      return false;
    curr1 = curr1->next;
    curr2 = curr2->next;
  }
  return (curr1 == nullptr) && (curr2 == nullptr);
}